

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_pack(REF_GEOM ref_geom,REF_INT *o2n)

{
  REF_INT *pRVar1;
  REF_DBL *pRVar2;
  int iVar3;
  REF_INT RVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  REF_INT *pRVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  iVar11 = ref_geom->max;
  if (iVar11 < 1) {
    iVar3 = 0;
  }
  else {
    pRVar1 = ref_geom->descr;
    lVar7 = 0;
    lVar10 = 0;
    iVar3 = 0;
    pRVar9 = pRVar1;
    do {
      if (pRVar1[lVar10 * 6] != -1) {
        lVar12 = 0;
        do {
          pRVar1[iVar3 * 6 + lVar12] = pRVar9[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 6);
        pRVar1[(long)(iVar3 * 6) + 5] = o2n[pRVar1[lVar10 * 6 + 5]];
        pRVar2 = ref_geom->param;
        lVar12 = 0;
        do {
          pRVar2[iVar3 * 2 + lVar12] = *(REF_DBL *)((long)pRVar2 + lVar12 * 8 + lVar7);
          lVar12 = lVar12 + 1;
        } while (lVar12 == 1);
        iVar3 = iVar3 + 1;
      }
      lVar10 = lVar10 + 1;
      iVar11 = ref_geom->max;
      pRVar9 = pRVar9 + 6;
      lVar7 = lVar7 + 0x10;
    } while (lVar10 < iVar11);
  }
  iVar8 = ref_geom->n;
  lVar7 = (long)iVar8;
  if (iVar3 == iVar8) {
    RVar4 = -1;
    if (iVar8 < iVar11) {
      iVar11 = ref_geom->max;
      if (iVar8 < iVar11) {
        piVar6 = ref_geom->descr + lVar7 * 6 + 1;
        do {
          iVar8 = iVar8 + 1;
          piVar6[-1] = -1;
          lVar7 = lVar7 + 1;
          *piVar6 = iVar8;
          iVar11 = ref_geom->max;
          piVar6 = piVar6 + 6;
        } while (lVar7 < iVar11);
      }
      ref_geom->descr[iVar11 * 6 + -5] = -1;
      RVar4 = ref_geom->n;
    }
    ref_geom->blank = RVar4;
    uVar5 = ref_adj_free(ref_geom->ref_adj);
    if (uVar5 == 0) {
      uVar5 = ref_adj_create(&ref_geom->ref_adj);
      if (uVar5 == 0) {
        if (ref_geom->max < 1) {
          uVar5 = 0;
        }
        else {
          lVar7 = 0;
          lVar10 = 0;
          do {
            if ((*(int *)((long)ref_geom->descr + lVar7) != -1) &&
               (uVar5 = ref_adj_add(ref_geom->ref_adj,
                                    *(REF_INT *)((long)ref_geom->descr + lVar7 + 0x14),
                                    (REF_INT)lVar10), uVar5 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xf5,"ref_geom_pack",(ulong)uVar5,"register geom");
              return uVar5;
            }
            lVar10 = lVar10 + 1;
            lVar7 = lVar7 + 0x18;
            uVar5 = 0;
          } while (lVar10 < ref_geom->max);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf1
               ,"ref_geom_pack",(ulong)uVar5,"create ref_adj for ref_geom");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf0,
             "ref_geom_pack",(ulong)uVar5,"free to prevent leak");
    }
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe5,
           "ref_geom_pack","count mismatch",(long)iVar3,lVar7);
    uVar5 = 1;
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_pack(REF_GEOM ref_geom, REF_INT *o2n) {
  REF_INT geom, compact, i;
  compact = 0;
  each_ref_geom(ref_geom, geom) {
    for (i = 0; i < REF_GEOM_DESCR_SIZE; i++)
      ref_geom_descr(ref_geom, i, compact) = ref_geom_descr(ref_geom, i, geom);
    ref_geom_node(ref_geom, compact) = o2n[ref_geom_node(ref_geom, geom)];
    for (i = 0; i < 2; i++)
      ref_geom_param(ref_geom, i, compact) = ref_geom_param(ref_geom, i, geom);
    compact++;
  }
  REIS(compact, ref_geom_n(ref_geom), "count mismatch");
  if (ref_geom_n(ref_geom) < ref_geom_max(ref_geom)) {
    for (geom = ref_geom_n(ref_geom); geom < ref_geom_max(ref_geom); geom++) {
      ref_geom_type(ref_geom, geom) = REF_EMPTY;
      ref_geom_id(ref_geom, geom) = geom + 1;
    }
    ref_geom_id(ref_geom, ref_geom_max(ref_geom) - 1) = REF_EMPTY;
    ref_geom_blank(ref_geom) = ref_geom_n(ref_geom);
  } else {
    ref_geom_blank(ref_geom) = REF_EMPTY;
  }
  RSS(ref_adj_free(ref_geom->ref_adj), "free to prevent leak");
  RSS(ref_adj_create(&(ref_geom->ref_adj)), "create ref_adj for ref_geom");

  each_ref_geom(ref_geom, geom) {
    RSS(ref_adj_add(ref_geom->ref_adj, ref_geom_node(ref_geom, geom), geom),
        "register geom");
  }

  return REF_SUCCESS;
}